

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_journal_rollback(Pager *pPager,int check_hot)

{
  unqlite_file **ppOut;
  unqlite_vfs *puVar1;
  unqlite_file *pChunk;
  SyMemBackend *pBackend;
  bool bVar2;
  sxu64 iNum;
  int iVar3;
  int iVar4;
  sxi32 sVar5;
  sxu32 sVar6;
  undefined1 *pContents;
  undefined1 *puVar7;
  undefined1 *puVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  sxu32 sVar12;
  long iOfft;
  sxi64 iOfft_00;
  int exists;
  uchar zMagic [8];
  int locked;
  sxu32 iSectorSize;
  sxu32 local_58;
  undefined4 uStack_54;
  sxu64 local_50;
  sxu32 local_44;
  sxu32 local_40;
  uint local_3c;
  pgno *local_38;
  
  if (check_hot != 0) {
    puVar1 = pPager->pVfs;
    local_58 = 1;
    bVar2 = false;
    iVar3 = (*puVar1->xAccess)(puVar1,pPager->zJournal,0,(int *)&local_58);
    if ((iVar3 != 0) || (local_58 == 0)) goto LAB_00116ef4;
    local_44 = 0;
    iVar3 = (*pPager->pfd->pMethods->xCheckReservedLock)(pPager->pfd,(int *)&local_44);
    if (local_44 == 0 && iVar3 == 0) {
      local_50 = 0;
      iVar3 = (*pPager->pfd->pMethods->xFileSize)(pPager->pfd,(unqlite_int64 *)&local_50);
      if (iVar3 != 0) goto LAB_00116ef1;
      bVar2 = true;
      if ((long)local_50 < 1) {
        iVar4 = pager_lock_db(pPager,2);
        if (iVar4 == 0) {
          bVar2 = false;
          (*puVar1->xDelete)(puVar1,pPager->zJournal,0);
          if (pPager->iLock == 0) goto LAB_00116ef4;
          (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
          pPager->iLock = 1;
        }
        goto LAB_00116ef1;
      }
    }
    else {
LAB_00116ef1:
      bVar2 = false;
    }
LAB_00116ef4:
    if (!bVar2) {
      return iVar3;
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"Cannot rollback journal file \'%s\' due to a read-only database handle",
               pPager->zJournal);
    return -0x4b;
  }
  ppOut = &pPager->pjfd;
  iVar3 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,ppOut,2);
  if (iVar3 != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while opening journal file: \'%s\'",pPager->zJournal);
    goto LAB_001170fb;
  }
  iVar3 = pager_lock_db(pPager,4);
  if (iVar3 != 0) {
    unqliteGenError(pPager->pDb,
                    "Cannot acquire an exclusive lock on the database while journal rollback");
    goto LAB_001170fb;
  }
  (*pPager->pjfd->pMethods->xSync)(pPager->pjfd,2);
  iVar4 = (*pPager->pjfd->pMethods->xFileSize)(pPager->pjfd,(unqlite_int64 *)&local_58);
  iVar11 = -0x1c;
  iVar3 = iVar11;
  if (((((((iVar4 == 0) && (0x1f < CONCAT44(uStack_54,local_58))) &&
         (iVar3 = (*(*ppOut)->pMethods->xRead)(*ppOut,&local_50,8,0), iVar3 == 0)) &&
        ((sVar5 = SyMemcmp(&local_50,aJournalMagic,8), iVar3 = iVar11, sVar5 == 0 &&
         (iVar3 = ReadInt32(*ppOut,&local_40,8), iVar3 == 0)))) &&
       ((iVar3 = ReadInt32(pPager->pjfd,&pPager->cksumInit,0xc), iVar3 == 0 &&
        ((iVar3 = ReadInt64(*ppOut,&pPager->dbSize,0x10), iVar3 == 0 &&
         (iVar3 = ReadInt32(*ppOut,&local_3c,0x18), iVar3 == 0)))))) &&
      (iVar3 = ReadInt32(*ppOut,&local_44,0x1c), iVar3 == 0)) &&
     (((iVar3 = iVar11, 0xffff001e < local_3c - 0x10001 && 0xffff01fe < local_44 - 0x10001 &&
       ((local_44 + 0x1ffff & local_44) == 0)) && ((local_3c + 0x1ffff & local_3c) == 0)))) {
    pPager->iSectorSize = local_3c;
    pPager->iPageSize = local_44;
    pPager->iJournalOfft = (ulong)local_3c;
    iVar3 = 0;
  }
  if (iVar3 == -0x1c) {
    pContents = (undefined1 *)0x0;
LAB_0011709e:
    SyMemBackendFree(pPager->pAllocator,pContents);
    if (iVar3 == 0) {
      (*pPager->pfd->pMethods->xSync)(pPager->pfd,3);
    }
    if (iVar3 == -0x1c) {
      iVar3 = 0;
    }
  }
  else if (iVar3 == 0) {
    iVar3 = (*pPager->pfd->pMethods->xTruncate)
                      (pPager->pfd,(long)pPager->iPageSize * pPager->dbSize);
    if (iVar3 == 0) {
      pContents = (undefined1 *)SyMemBackendAlloc(pPager->pAllocator,pPager->iPageSize);
      if (pContents != (undefined1 *)0x0) {
        if ((ulong)(uint)pPager->iPageSize != 0) {
          puVar7 = pContents + (uint)pPager->iPageSize;
          puVar8 = pContents;
          do {
            *puVar8 = 0;
            if (puVar7 <= puVar8 + 1) break;
            puVar8[1] = 0;
            if (puVar7 <= puVar8 + 2) break;
            puVar8[2] = 0;
            if (puVar7 <= puVar8 + 3) break;
            puVar8[3] = 0;
            puVar8 = puVar8 + 4;
          } while (puVar8 < puVar7);
        }
        if (local_40 == 0) {
          iVar3 = 0;
        }
        else {
          iOfft_00 = pPager->iJournalOfft;
          sVar12 = 0;
          local_38 = &pPager->dbSize;
          do {
            iVar3 = ReadInt64(*ppOut,&local_50,iOfft_00);
            if (iVar3 == 0) {
              iVar3 = (*pPager->pjfd->pMethods->xRead)
                                (pPager->pjfd,pContents,(long)pPager->iPageSize,iOfft_00 + 8);
              if (iVar3 == 0) {
                iOfft = iOfft_00 + 8 + (long)pPager->iPageSize;
                iVar3 = ReadInt32(pPager->pjfd,&local_58,iOfft);
                iNum = local_50;
                if (iVar3 == 0) {
                  sVar6 = pPager->cksumInit;
                  lVar10 = (long)pPager->iPageSize;
                  if (200 < lVar10) {
                    lVar9 = lVar10 + 200;
                    do {
                      sVar6 = sVar6 + (byte)pContents[lVar9 + -400];
                      lVar9 = lVar9 + -200;
                    } while (400 < lVar9);
                  }
                  iOfft_00 = iOfft + 4;
                  iVar3 = -0x3f;
                  if (((local_58 == sVar6) && (iVar3 = 0, local_50 < *local_38)) &&
                     (iVar3 = (*pPager->pfd->pMethods->xWrite)
                                        (pPager->pfd,pContents,lVar10,local_50 * lVar10), iVar3 == 0
                     )) {
                    pager_fill_page(pPager,iNum,pContents);
                  }
                }
              }
            }
            if ((iVar3 != -0x3f) && (iVar3 != 0)) {
              unqliteGenError(pPager->pDb,"Page playback error");
              break;
            }
            sVar12 = sVar12 + 1;
          } while (sVar12 != local_40);
        }
        goto LAB_0011709e;
      }
      unqliteGenError(pPager->pDb,"unQLite is running out of memory");
      iVar3 = -1;
    }
    else {
      unqliteGenError(pPager->pDb,"IO error while truncating database file");
    }
  }
  else {
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while reading journal file \'%s\' header",pPager->zJournal);
  }
  if (pPager->iLock != 0) {
    (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
    pPager->iLock = 1;
  }
LAB_001170fb:
  pChunk = *ppOut;
  if (pChunk != (unqlite_file *)0x0) {
    pBackend = pPager->pAllocator;
    (*pChunk->pMethods->xClose)(pChunk);
    SyMemBackendFree(pBackend,pChunk);
  }
  *ppOut = (unqlite_file *)0x0;
  if (iVar3 == 0) {
    (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
  }
  return iVar3;
}

Assistant:

static int pager_journal_rollback(Pager *pPager,int check_hot)
{
	int rc;
	if( check_hot ){
		int iExists = 0; /* cc warning */
		/* Check if the journal file exists */
		rc = pager_has_hot_journal(pPager,&iExists);
		if( rc != UNQLITE_OK  ){
			/* IO error */
			return rc;
		}
		if( !iExists ){
			/* Journal file does not exists */
			return UNQLITE_OK;
		}
	}
	if( pPager->is_rdonly ){
		unqliteGenErrorFormat(pPager->pDb,
			"Cannot rollback journal file '%s' due to a read-only database handle",pPager->zJournal);
		return UNQLITE_READ_ONLY;
	}
	/* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the 
      ** hot-journal back.
      ** 
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to 
      ** this point in the code and fail to obtain its own EXCLUSIVE lock 
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
	/* Open the journal file */
	rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,UNQLITE_OPEN_READWRITE);
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pPager->pDb,"IO error while opening journal file: '%s'",pPager->zJournal);
		goto fail;
	}
	rc = pager_lock_db(pPager,EXCLUSIVE_LOCK);
	if( rc != UNQLITE_OK ){
		unqliteGenError(pPager->pDb,"Cannot acquire an exclusive lock on the database while journal rollback");
		goto fail;
	}
	/* Sync the journal file */
	unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
	/* Finally rollback the database */
	rc = pager_playback(pPager);
	/* Switch back to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
fail:
	/* Close the journal handle */
	unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
	pPager->pjfd = 0;
	if( rc == UNQLITE_OK ){
		/* Delete the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,TRUE);
	}
	return rc;
}